

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::plaininstr<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  size_t sVar1;
  MaybeResult<wasm::Ok> *pMVar2;
  undefined1 local_f0 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> keyword;
  undefined8 uStack_b8;
  char buf [33];
  allocator<char> local_88 [32];
  size_t local_68;
  undefined1 local_60 [8];
  Result<wasm::Ok> _val;
  
  sVar1 = (ctx->in).pos;
  Lexer::takeKeyword((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_f0,
                     &ctx->in);
  if (keyword.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._8_1_ == '\0') {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
  }
  else {
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    uStack_b8 = 0;
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[0x18] = '\0';
    local_68 = sVar1;
    if ((ulong)local_f0 < 0x21) {
      _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_ = __return_storage_ptr__;
      memcpy(&uStack_b8,
             (void *)keyword.
                     super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                     ._M_payload._M_value._M_len,(size_t)local_f0);
      __return_storage_ptr__ =
           (MaybeResult<wasm::Ok> *)
           _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err>._32_8_;
      if ((byte)uStack_b8 - 0x61 < 0x16) {
        pMVar2 = (MaybeResult<wasm::Ok> *)
                 (*(code *)(&DAT_00e49fe0 +
                           *(int *)(&DAT_00e49fe0 + (ulong)((byte)uStack_b8 - 0x61) * 4)))();
        return pMVar2;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &keyword.
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_engaged,"unrecognized instruction",local_88);
    Lexer::err((Err *)local_60,&ctx->in,local_68,
               (string *)
               &keyword.
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_engaged);
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__,
               local_60);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string
              ((string *)
               &keyword.
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_engaged);
  }
  return (MaybeResult<wasm::Ok> *)
         (_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)__return_storage_ptr__;
}

Assistant:

MaybeResult<> plaininstr(Ctx& ctx, const std::vector<Annotation>& annotations) {
  ctx.setSrcLoc(annotations);
  auto pos = ctx.in.getPos();
  auto keyword = ctx.in.takeKeyword();
  if (!keyword) {
    return {};
  }

#include <gen-s-parser.inc>
}